

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O2

void __thiscall
QGlibNetworkInformationBackend::QGlibNetworkInformationBackend(QGlibNetworkInformationBackend *this)

{
  undefined8 uVar1;
  
  QNetworkInformationBackend::QNetworkInformationBackend((QNetworkInformationBackend *)this);
  *(undefined ***)this = &PTR_metaObject_00105a90;
  uVar1 = g_network_monitor_get_default();
  *(undefined8 *)(this + 0x28) = uVar1;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  updateConnectivity((QGlibNetworkInformationBackend *)this);
  updateMetered((QGlibNetworkInformationBackend *)this);
  uVar1 = g_signal_connect_data
                    (*(undefined8 *)(this + 0x28),"notify::connectivity",updateConnectivity,this,0,2
                    );
  *(undefined8 *)(this + 0x30) = uVar1;
  uVar1 = g_signal_connect_data
                    (*(undefined8 *)(this + 0x28),"notify::network-metered",updateMetered,this,0,2);
  *(undefined8 *)(this + 0x38) = uVar1;
  return;
}

Assistant:

QGlibNetworkInformationBackend::QGlibNetworkInformationBackend()
: networkMonitor(g_network_monitor_get_default())
{
    updateConnectivity(this);
    updateMetered(this);

    connectivityHandlerId = g_signal_connect_swapped(networkMonitor, "notify::connectivity",
                                                     G_CALLBACK(updateConnectivity), this);

    meteredHandlerId = g_signal_connect_swapped(networkMonitor, "notify::network-metered",
                                                G_CALLBACK(updateMetered), this);
}